

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

iterator divsufsortxx::helper::
         median5<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                   (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator v1,
                   iterator v2,iterator v3,iterator v4,iterator v5)

{
  iterator iVar1;
  value_type vVar2;
  value_type vVar3;
  int iVar4;
  int iVar5;
  BitmapArray<long> *in_R8;
  pos_type in_R9;
  BitmapArray<long> *in_stack_00000020;
  pos_type in_stack_00000028;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *this;
  BitmapArray<long> *local_10;
  pos_type local_8;
  
  this = (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> *)&stack0x00000030;
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11c1ab);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11c1c8);
  vVar2 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (this,CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11c1e9);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11c206);
  vVar3 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (this,CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  if (vVar3 < vVar2) {
    std::swap<bitmap::BitmapArray<long>::iterator>
              ((iterator *)this,
               (iterator *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  }
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11c23f);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11c25c);
  vVar2 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (this,CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  iVar4 = (int)vVar2;
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11c27a);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11c297);
  vVar2 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (this,CONCAT44(iVar4,in_stack_fffffffffffffed8));
  if (vVar2 < iVar4) {
    std::swap<bitmap::BitmapArray<long>::iterator>
              ((iterator *)this,(iterator *)CONCAT44(iVar4,in_stack_fffffffffffffed8));
  }
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11c2cd);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11c2ea);
  vVar2 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (this,CONCAT44(iVar4,in_stack_fffffffffffffed8));
  iVar5 = (int)vVar2;
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11c308);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11c325);
  vVar2 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (this,CONCAT44(iVar4,iVar5));
  if (vVar2 < iVar5) {
    std::swap<bitmap::BitmapArray<long>::iterator>
              ((iterator *)this,(iterator *)CONCAT44(iVar4,iVar5));
    std::swap<bitmap::BitmapArray<long>::iterator>
              ((iterator *)this,(iterator *)CONCAT44(iVar4,iVar5));
  }
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11c370);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11c38d);
  vVar2 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (this,CONCAT44(iVar4,iVar5));
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11c3ae);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11c3c5);
  vVar3 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (this,CONCAT44(iVar4,iVar5));
  if (vVar3 < vVar2) {
    std::swap<bitmap::BitmapArray<long>::iterator>
              ((iterator *)this,(iterator *)CONCAT44(iVar4,iVar5));
  }
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11c401);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11c415);
  vVar2 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (this,CONCAT44(iVar4,iVar5));
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11c433);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11c447);
  vVar3 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (this,CONCAT44(iVar4,iVar5));
  if (vVar3 < vVar2) {
    std::swap<bitmap::BitmapArray<long>::iterator>
              ((iterator *)this,(iterator *)CONCAT44(iVar4,iVar5));
    std::swap<bitmap::BitmapArray<long>::iterator>
              ((iterator *)this,(iterator *)CONCAT44(iVar4,iVar5));
  }
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11c492);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11c4a6);
  vVar2 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (this,CONCAT44(iVar4,iVar5));
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11c4c4);
  bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11c4d8);
  vVar3 = substring::substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator>::operator[]
                    (this,CONCAT44(iVar4,iVar5));
  local_10 = in_R8;
  local_8 = in_R9;
  if (vVar3 < vVar2) {
    local_10 = in_stack_00000020;
    local_8 = in_stack_00000028;
  }
  iVar1.pos_ = local_8;
  iVar1.array_ = local_10;
  return iVar1;
}

Assistant:

SAIterator_type median5(const StringIterator_type Td, SAIterator_type v1,
                        SAIterator_type v2, SAIterator_type v3,
                        SAIterator_type v4, SAIterator_type v5) {
  if (Td[*v2] > Td[*v3]) {
    std::swap(v2, v3);
  }
  if (Td[*v4] > Td[*v5]) {
    std::swap(v4, v5);
  }
  if (Td[*v2] > Td[*v4]) {
    std::swap(v2, v4);
    std::swap(v3, v5);
  }
  if (Td[*v1] > Td[*v3]) {
    std::swap(v1, v3);
  }
  if (Td[*v1] > Td[*v4]) {
    std::swap(v1, v4);
    std::swap(v3, v5);
  }
  if (Td[*v3] > Td[*v4]) {
    return v4;
  }
  return v3;
}